

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_loop_expand.cpp
# Opt level: O2

loop_info * __thiscall
optimization::loop_expand::loop_info::operator++
          (loop_info *__return_storage_ptr__,loop_info *this,int param_1)

{
  int *piVar1;
  int iVar2;
  ostream *poVar3;
  loop_info *tag;
  Function *pFVar4;
  char *tag_00;
  Tag *tag_01;
  allocator<char> local_103;
  allocator<char> local_102;
  ostream local_101;
  string local_100;
  undefined1 local_e0 [80];
  undefined **local_90;
  undefined8 local_88;
  undefined1 local_80;
  Function local_78;
  
  tag = this;
  loop_info(__return_storage_ptr__,this);
  switch(this->change_op) {
  case Add:
    piVar1 = &(this->init_var).second;
    *piVar1 = *piVar1 + this->change_value;
    break;
  case Sub:
    piVar1 = &(this->init_var).second;
    *piVar1 = *piVar1 - this->change_value;
    break;
  case Mul:
    iVar2 = (this->init_var).second * this->change_value;
    goto LAB_00145e53;
  case Div:
    iVar2 = (this->init_var).second / this->change_value;
LAB_00145e53:
    (this->init_var).second = iVar2;
    break;
  default:
    local_101 = (ostream)0x5;
    AixLog::operator<<(&local_101,(Severity *)tag);
    AixLog::Tag::Tag((Tag *)(local_e0 + 0x20));
    AixLog::operator<<((ostream *)(local_e0 + 0x20),(Tag *)tag);
    local_88 = std::chrono::_V2::system_clock::now();
    local_90 = &PTR__Timestamp_001d8f28;
    local_80 = 0;
    AixLog::operator<<((ostream *)&local_90,(Timestamp *)tag);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_e0,"operator++",&local_102);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
               ,&local_103);
    pFVar4 = (Function *)local_e0;
    AixLog::Function::Function(&local_78,(string *)pFVar4,&local_100,0xa6);
    AixLog::operator<<((ostream *)&local_78,pFVar4);
    tag_00 = "ERROR ! Unrecognized change_op";
    std::operator<<((ostream *)&std::clog,"ERROR ! Unrecognized change_op");
    AixLog::Function::~Function(&local_78);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)local_e0);
    AixLog::Tag::~Tag((Tag *)(local_e0 + 0x20));
    local_101 = (ostream)0x5;
    AixLog::operator<<(&local_101,(Severity *)tag_00);
    AixLog::Tag::Tag((Tag *)(local_e0 + 0x20));
    AixLog::operator<<((ostream *)(local_e0 + 0x20),(Tag *)tag_00);
    local_88 = std::chrono::_V2::system_clock::now();
    local_90 = &PTR__Timestamp_001d8f28;
    local_80 = 0;
    AixLog::operator<<((ostream *)&local_90,(Timestamp *)tag_00);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_e0,"operator++",&local_102);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
               ,&local_103);
    pFVar4 = (Function *)local_e0;
    AixLog::Function::Function(&local_78,(string *)pFVar4,&local_100,0xa7);
    AixLog::operator<<((ostream *)&local_78,pFVar4);
    tag_01 = (Tag *)(ulong)this->change_op;
    mir::inst::display_op((ostream *)&std::clog,this->change_op);
    AixLog::Function::~Function(&local_78);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)local_e0);
    AixLog::Tag::~Tag((Tag *)(local_e0 + 0x20));
    local_101 = (ostream)0x5;
    AixLog::operator<<(&local_101,(Severity *)tag_01);
    AixLog::Tag::Tag((Tag *)(local_e0 + 0x20));
    AixLog::operator<<((ostream *)(local_e0 + 0x20),tag_01);
    local_88 = std::chrono::_V2::system_clock::now();
    local_90 = &PTR__Timestamp_001d8f28;
    local_80 = 0;
    AixLog::operator<<((ostream *)&local_90,(Timestamp *)tag_01);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_e0,"operator++",&local_102);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
               ,&local_103);
    pFVar4 = (Function *)local_e0;
    AixLog::Function::Function(&local_78,(string *)pFVar4,&local_100,0xa8);
    AixLog::operator<<((ostream *)&local_78,pFVar4);
    poVar3 = std::operator<<((ostream *)&std::clog," ! ");
    std::endl<char,std::char_traits<char>>(poVar3);
    AixLog::Function::~Function(&local_78);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)local_e0);
    AixLog::Tag::~Tag((Tag *)(local_e0 + 0x20));
    break;
  case Rem:
    (this->init_var).second = (this->init_var).second % this->change_value;
  }
  return __return_storage_ptr__;
}

Assistant:

loop_info operator++(int) {
    loop_info res(*this);
    switch (change_op) {
      case mir::inst::Op::Add: {
        init_var.second += change_value;
        break;
      }
      case mir::inst::Op::Sub: {
        init_var.second -= change_value;
        break;
      }
      case mir::inst::Op::Mul: {
        init_var.second *= change_value;
        break;
      }
      case mir::inst::Op::Div: {
        init_var.second /= change_value;
        break;
      }
      case mir::inst::Op::Rem: {
        init_var.second %= change_value;
        break;
      }
      default: {
        LOG(ERROR) << "ERROR ! Unrecognized change_op";
        mir::inst::display_op(LOG(ERROR), change_op);
        LOG(ERROR) << " ! " << std::endl;
        break;
      }
    }
    return res;
  }